

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucci.cpp
# Opt level: O1

int ReadDigit(char **LineStr,int MaxValue)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  
  pcVar2 = *LineStr;
  cVar3 = *pcVar2;
  iVar1 = 0;
  if ((byte)(cVar3 - 0x30U) < 10) {
    iVar1 = 0;
    do {
      pcVar2 = pcVar2 + 1;
      iVar1 = (uint)(byte)(cVar3 - 0x30) + iVar1 * 10;
      *LineStr = pcVar2;
      if (MaxValue <= iVar1) {
        iVar1 = MaxValue;
      }
      cVar3 = *pcVar2;
    } while ((byte)(cVar3 - 0x30U) < 10);
  }
  return iVar1;
}

Assistant:

int ReadDigit(const char *&LineStr, int MaxValue) {
    int RetValue;
    RetValue = 0;
    while (1) {
        if (*LineStr >= '0' && *LineStr <= '9') {
            RetValue *= 10;
            RetValue += *LineStr - '0';
            LineStr ++;
            if (RetValue > MaxValue) {
                RetValue = MaxValue;
            }
        } else {
            break;
        }
    }
    return RetValue;
}